

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::GetPropertyWPCache<false,Js::JavascriptString*>
               (Var instance,RecyclableObject *propertyObject,JavascriptString *propertyKey,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  RecyclableObject *pRVar7;
  Type *pTVar8;
  
  if (value == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x7ff,"(value)","value");
    if (!bVar3) {
LAB_00ac4123:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((propertyObject->type).ptr)->typeId != TypeIds_Null) {
    pTVar8 = &propertyObject->type;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      iVar4 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x13])
                        (propertyObject,instance,propertyKey,value,info,requestContext);
      if (iVar4 != 0) {
        bVar3 = VarIs<Js::UnscopablesWrapperObject,Js::RecyclableObject>(propertyObject);
        if ((!bVar3) && (info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0)) {
          CacheOperators::CachePropertyRead
                    (instance,propertyObject,false,
                     ((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,false,info,
                     requestContext);
        }
        return (uint)(iVar4 == 1);
      }
      BVar5 = RecyclableObject::SkipsPrototype(propertyObject);
      if (BVar5 != 0) break;
      pTVar1 = pTVar8->ptr;
      if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) == TypeFlagMask_None) {
LAB_00ac407c:
        propertyObject = (pTVar1->prototype).ptr;
      }
      else if (pTVar1->typeId == TypeIds_Proxy) {
        propertyObject = (pTVar1->prototype).ptr;
        if (propertyObject !=
            (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
              ->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.
            ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x57a,
                                      "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                      ,
                                      "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                     );
          if (bVar3) {
            *puVar6 = 0;
            goto LAB_00ac407c;
          }
          goto LAB_00ac4123;
        }
      }
      else {
        iVar4 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(propertyObject);
        propertyObject = (RecyclableObject *)CONCAT44(extraout_var,iVar4);
      }
      pTVar8 = &propertyObject->type;
    } while (((propertyObject->type).ptr)->typeId != TypeIds_Null);
  }
  if (info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0) {
    TryCacheMissingProperty
              (instance,instance,false,((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,
               requestContext,info);
  }
  pRVar7 = ScriptContext::GetMissingPropertyResult(requestContext);
  *value = pRVar7;
  return 0;
}

Assistant:

BOOL JavascriptOperators::GetPropertyWPCache(Var instance, RecyclableObject* propertyObject, PropertyKeyType propertyKey, Var* value, ScriptContext* requestContext, _Inout_ PropertyValueInfo * info)
    {
        Assert(value);
        RecyclableObject* object = propertyObject;
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result = QueryGetOrHasProperty<OutputExistence>(instance, object, propertyKey, value, info, requestContext);

            if (result != PropertyQueryFlags::Property_NotFound)
            {
                if (!VarIs<UnscopablesWrapperObject>(object) && info->GetPropertyRecordUsageCache())
                {
                    PropertyId propertyId = info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId();
                    CacheOperators::CachePropertyRead(instance, object, false, propertyId, false, info, requestContext);
                }
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }

            // SkipsPrototype refers only to the Get operation, not Has. Some objects like CustomExternalObject respond
            // to HasPropertyQuery with info only about the object itself and GetPropertyQuery with info about its prototype chain.
            // For consistency with the behavior of JavascriptOperators::HasProperty, don't skip prototypes when outputting existence.
            if (!OutputExistence && object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        if (info->GetPropertyRecordUsageCache())
        {
            TryCacheMissingProperty(instance, instance, false /*isRoot*/, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), requestContext, info);
        }

        *value = OutputExistence
            ? requestContext->GetLibrary()->GetFalse()
            : requestContext->GetMissingPropertyResult();
        return FALSE;
    }